

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedElastic.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<7,_2>::MixedElastic::MixedElastic
          (MixedElastic *this,MixedElastic *param_1)

{
  CoherentElastic::CoherentElastic(&this->coherent_,&param_1->coherent_);
  TabulationRecord::TabulationRecord
            (&(this->incoherent_).super_TabulationRecord,
             &(param_1->incoherent_).super_TabulationRecord);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT MixedElastic {

  /* fields */
  CoherentElastic coherent_;
  IncoherentElastic incoherent_;

public:

  /* constructor */
  #include "ENDFtk/section/7/2/MixedElastic/src/ctor.hpp"

  /**
   *  @brief Return the LTHR flag for mixed elastic scattering
   */
  static constexpr int LTHR() { return 3; }

  /**
   *  @brief Return the LTHR flag for mixed elastic scattering
   */
  int elasticScatteringType() const { return this->LTHR(); }

  /**
   *  @brief Return the coherent elastic scattering data
   */
  const CoherentElastic& coherent() const { return this->coherent_; }

  /**
   *  @brief Return the incoherent elastic scattering data
   */
  const IncoherentElastic& incoherent() const { return this->incoherent_; }

  #include "ENDFtk/section/7/2/MixedElastic/src/NC.hpp"
  #include "ENDFtk/section/7/2/MixedElastic/src/print.hpp"
}